

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

void pi_destroy_v2(opj_pi_iterator_t *p_pi,OPJ_UINT32 p_nb_elements)

{
  uint uVar1;
  opj_pi_iterator_t *l_current_pi;
  opj_pi_iterator_t *poVar2;
  uint uVar3;
  opj_pi_resolution_t **ppoVar4;
  opj_pi_comp_t *__ptr;
  OPJ_UINT32 OVar5;
  
  if (p_pi != (opj_pi_iterator_t *)0x0) {
    if (p_pi->include != (short *)0x0) {
      free(p_pi->include);
      p_pi->include = (short *)0x0;
    }
    if (p_nb_elements != 0) {
      OVar5 = 0;
      poVar2 = p_pi;
      do {
        __ptr = poVar2->comps;
        if (__ptr != (opj_pi_comp_t *)0x0) {
          uVar1 = poVar2->numcomps;
          if (uVar1 != 0) {
            ppoVar4 = &__ptr->resolutions;
            uVar3 = 0;
            do {
              if (*ppoVar4 != (opj_pi_resolution_t *)0x0) {
                free(*ppoVar4);
                *ppoVar4 = (opj_pi_resolution_t *)0x0;
                uVar1 = poVar2->numcomps;
              }
              uVar3 = uVar3 + 1;
              ppoVar4 = ppoVar4 + 3;
            } while (uVar3 < uVar1);
            __ptr = poVar2->comps;
          }
          free(__ptr);
          poVar2->comps = (opj_pi_comp_t *)0x0;
        }
        poVar2 = poVar2 + 1;
        OVar5 = OVar5 + 1;
      } while (OVar5 != p_nb_elements);
    }
    free(p_pi);
    return;
  }
  return;
}

Assistant:

void pi_destroy_v2(
				opj_pi_iterator_t *p_pi,
				OPJ_UINT32 p_nb_elements)
{
	OPJ_UINT32 compno, pino;
	opj_pi_iterator_t *l_current_pi = p_pi;
	if
		(p_pi)
	{
		if
			(p_pi->include)
		{
			opj_free(p_pi->include);
			p_pi->include = 00;
		}
		// TODO
		for
			(pino = 0; pino < p_nb_elements; ++pino)
		{
			if
				(l_current_pi->comps)
			{
				opj_pi_comp_t *l_current_component = l_current_pi->comps;
				for
					(compno = 0; compno < l_current_pi->numcomps; compno++)
				{
					if
						(l_current_component->resolutions)
					{
						opj_free(l_current_component->resolutions);
						l_current_component->resolutions = 00;
					}
					++l_current_component;
				}
				opj_free(l_current_pi->comps);
				l_current_pi->comps = 0;
			}
			++l_current_pi;
		}
		opj_free(p_pi);
	}
}